

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O0

vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> * __thiscall
tiger::trains::world::Point::getTrains(Point *this)

{
  bool bVar1;
  Point *in_RSI;
  Train *in_RDI;
  Train *train;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *__range2;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *res;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
  *in_stack_ffffffffffffff88;
  Point *in_stack_ffffffffffffff90;
  Train *this_00;
  __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
  local_38 [3];
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::vector
            ((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
              *)0x23d3bf);
  local_20 = World::getTrainList(in_RSI->owner);
  local_38[0]._M_current =
       (Train **)
       std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
       begin(in_stack_ffffffffffffff88);
  std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::end
            (in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
                             *)in_stack_ffffffffffffff90,
                            (__normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
                             *)in_stack_ffffffffffffff88), bVar1) {
    __gnu_cxx::
    __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
    ::operator*(local_38);
    in_stack_ffffffffffffff90 = Train::getPoint(in_RDI);
    if (in_stack_ffffffffffffff90 == in_RSI) {
      std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
      push_back((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                 *)this_00,(value_type *)in_RDI);
    }
    __gnu_cxx::
    __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
    ::operator++(local_38);
  }
  return (vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *)
         this_00;
}

Assistant:

const std::vector<Train *> Point::getTrains() const
{
    std::vector<Train *> res;

    for (Train *train : owner->getTrainList())
        if (train->getPoint() == this)
            res.push_back(train);

    return res;
}